

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

size_type __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  size_type sVar1;
  const_iterator local_a8;
  iterator local_58;
  
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_58,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this,key);
  local_a8.ht = local_58.ht;
  local_a8.pos.row_begin._M_current = local_58.pos.row_begin._M_current;
  local_a8.pos.row_end._M_current = local_58.pos.row_end._M_current;
  local_a8.pos.row_current._M_current = local_58.pos.row_current._M_current;
  local_a8.pos.col_current = local_58.pos.col_current;
  local_a8.end.row_begin._M_current = local_58.end.row_begin._M_current;
  local_a8.end.row_end._M_current = local_58.end.row_end._M_current;
  local_a8.end.row_current._M_current = local_58.end.row_current._M_current;
  local_a8.end.col_current = local_58.end.col_current;
  local_58.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.pos.col_current = (const_nonempty_iterator)0x0;
  local_58.end.col_current = (nonempty_iterator)0x0;
  local_58.ht = this;
  local_58.pos.row_current._M_current = local_58.pos.row_end._M_current;
  local_58.end.row_begin._M_current = local_58.pos.row_begin._M_current;
  local_58.end.row_end._M_current = local_58.pos.row_end._M_current;
  local_58.end.row_current._M_current = local_58.pos.row_end._M_current;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_58);
  if ((((local_a8.pos.row_begin._M_current == local_58.pos.row_begin._M_current) &&
       (local_a8.pos.row_end._M_current == local_58.pos.row_end._M_current)) &&
      (local_a8.pos.row_current._M_current == local_58.pos.row_current._M_current)) &&
     ((local_a8.pos.row_current._M_current == local_a8.pos.row_end._M_current ||
      (local_a8.pos.col_current == local_58.pos.col_current)))) {
    sVar1 = 0;
  }
  else {
    set_deleted(this,&local_a8);
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = true;
    sVar1 = 1;
  }
  return sVar1;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }